

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

enable_if_t<std::is_arithmetic<unsigned_short>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_short>::operator()
          (void *this,string *out,unsigned_short in)

{
  string local_40;
  unsigned_short local_1a;
  string *psStack_18;
  unsigned_short in_local;
  string *out_local;
  LexicalCast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *this_local;
  
  local_1a = in;
  psStack_18 = out;
  out_local = (string *)this;
  std::__cxx11::to_string(&local_40,(uint)in);
  std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }